

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TabulatedBackgroundRMatrix.test.cpp
# Opt level: O3

string * invalidLBK_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)in_RDI,
             " 0.000000+0 0.000000+0          1          5          0          02625 2151     \n 0.000000+0 0.000000+0          0          0          1          22625 2151     \n          2          2                                            2625 2151     \n 1.000000-5 1.000000+0 2.000000+7 2.000000+0                      2625 2151     \n 0.000000+0 0.000000+0          0          0          1          22625 2151     \n          2          2                                            2625 2151     \n 1.000000-5 2.000000+0 2.000000+7 1.000000+0                      2625 2151     \n"
             ,"");
  return in_RDI;
}

Assistant:

std::string invalidLBK() {
  return
  " 0.000000+0 0.000000+0          1          5          0          02625 2151     \n"
  " 0.000000+0 0.000000+0          0          0          1          22625 2151     \n"
  "          2          2                                            2625 2151     \n"
  " 1.000000-5 1.000000+0 2.000000+7 2.000000+0                      2625 2151     \n"
  " 0.000000+0 0.000000+0          0          0          1          22625 2151     \n"
  "          2          2                                            2625 2151     \n"
  " 1.000000-5 2.000000+0 2.000000+7 1.000000+0                      2625 2151     \n";

}